

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::EventTriggerStatement::fromSyntax
          (Compilation *compilation,EventTriggerStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  ASTContext *this;
  socklen_t __len;
  SourceLocation in_RDX;
  TimingControl *in_RSI;
  StatementContext *in_RDI;
  SourceRange SVar2;
  bool isNonBlocking;
  TimingControl *timing;
  Expression *target;
  Statement *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff70;
  SourceRange *in_stack_ffffffffffffff80;
  SourceLocation args_1;
  SourceLocation in_stack_ffffffffffffff98;
  DiagCode in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  ExpressionSyntax *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [16];
  unkbyte9 Var3;
  SyntaxNode *this_00;
  bitmask<slang::ast::AssignFlags> local_31;
  Expression *local_30;
  SourceLocation local_20;
  EventTriggerStatement *local_8;
  
  Var3 = in_stack_ffffffffffffffb8._8_9_;
  local_20 = in_RDX;
  this = (ASTContext *)
         not_null<slang::syntax::NameSyntax_*>::operator*
                   ((not_null<slang::syntax::NameSyntax_*> *)0xa77522);
  args_1 = local_20;
  memset(&local_31,0,1);
  bitmask<slang::ast::AssignFlags>::bitmask(&local_31);
  this_00 = (SyntaxNode *)((unkuint9)Var3 >> 8);
  local_30 = Expression::bindLValue
                       (in_stack_ffffffffffffffb0,
                        (ASTContext *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                        (bitmask<slang::ast::AssignFlags>)(underlying_type)Var3);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff70);
  if (bVar1) {
    local_8 = (EventTriggerStatement *)
              Statement::badStmt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa775a1);
    bVar1 = Type::isEvent((Type *)0xa775a9);
    if (bVar1) {
      if (in_RSI[3].syntax != (SyntaxNode *)0x0) {
        TimingControl::bind((int)in_RSI[3].syntax,(sockaddr *)local_20,__len);
        Statement::StatementContext::observeTiming(in_RDI,in_RSI);
      }
      SVar2 = slang::syntax::SyntaxNode::sourceRange(this_00);
      local_8 = BumpAllocator::
                emplace<slang::ast::EventTriggerStatement,slang::ast::Expression_const&,slang::ast::TimingControl_const*&,bool&,slang::SourceRange>
                          ((BumpAllocator *)SVar2.endLoc,(Expression *)SVar2.startLoc,
                           (TimingControl **)args_1,(bool *)this,in_stack_ffffffffffffff80);
    }
    else {
      not_null<slang::syntax::NameSyntax_*>::operator->
                ((not_null<slang::syntax::NameSyntax_*> *)0xa775d2);
      slang::syntax::SyntaxNode::sourceRange(this_00);
      SVar2.endLoc = in_stack_ffffffffffffff98;
      SVar2.startLoc = args_1;
      ASTContext::addDiag(this,in_stack_ffffffffffffffa4,SVar2);
      local_8 = (EventTriggerStatement *)
                Statement::badStmt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& EventTriggerStatement::fromSyntax(Compilation& compilation,
                                             const EventTriggerStatementSyntax& syntax,
                                             const ASTContext& context, StatementContext& stmtCtx) {
    auto& target = Expression::bindLValue(*syntax.name, context);
    if (target.bad())
        return badStmt(compilation, nullptr);

    if (!target.type->isEvent()) {
        context.addDiag(diag::NotAnEvent, syntax.name->sourceRange());
        return badStmt(compilation, nullptr);
    }

    const TimingControl* timing = nullptr;
    if (syntax.timing) {
        timing = &TimingControl::bind(*syntax.timing, context);
        stmtCtx.observeTiming(*timing);
    }

    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingEventTriggerStatement;

    return *compilation.emplace<EventTriggerStatement>(target, timing, isNonBlocking,
                                                       syntax.sourceRange());
}